

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O3

string * pbrt::(anonymous_namespace)::TimeNow_abi_cxx11_(void)

{
  tm *ptVar1;
  string *psVar2;
  _Put_time<char> __f;
  time_t t;
  tm tm;
  stringstream ss;
  time_t local_1e0;
  tm local_1d8;
  stringstream local_198 [16];
  basic_ostream<char,_std::char_traits<char>_> local_188 [112];
  ios_base local_118 [264];
  
  local_1e0 = ::time((time_t *)0x0);
  ptVar1 = localtime(&local_1e0);
  local_1d8.tm_sec = ptVar1->tm_sec;
  local_1d8.tm_min = ptVar1->tm_min;
  local_1d8.tm_hour = ptVar1->tm_hour;
  local_1d8.tm_mday = ptVar1->tm_mday;
  local_1d8.tm_mon = ptVar1->tm_mon;
  local_1d8.tm_year = ptVar1->tm_year;
  local_1d8.tm_wday = ptVar1->tm_wday;
  local_1d8.tm_yday = ptVar1->tm_yday;
  local_1d8.tm_isdst = ptVar1->tm_isdst;
  local_1d8._36_4_ = *(undefined4 *)&ptVar1->field_0x24;
  local_1d8.tm_gmtoff = ptVar1->tm_gmtoff;
  local_1d8.tm_zone = ptVar1->tm_zone;
  std::__cxx11::stringstream::stringstream(local_198);
  __f._M_fmt = "%Y%m%d.%H%M%S";
  __f._M_tmb = &local_1d8;
  std::operator<<(local_188,__f);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  psVar2 = (string *)std::ios_base::~ios_base(local_118);
  return psVar2;
}

Assistant:

std::string TimeNow() {
    std::time_t t = std::time(NULL);
    std::tm tm = *std::localtime(&t);
    std::stringstream ss;
    ss << std::put_time(&tm, "%Y%m%d.%H%M%S");
    return ss.str();
}